

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_textedit_layout_row
               (nk_text_edit_row *r,nk_text_edit *edit,int line_start_id,float row_height,
               nk_user_font *font)

{
  nk_size nVar1;
  int iVar2;
  char *begin;
  int iVar3;
  nk_vec2 nVar4;
  int glyphs;
  nk_rune unicode;
  int l;
  char *remaining;
  int in_stack_ffffffffffffffb8;
  int local_3c;
  nk_rune local_38;
  int local_34;
  char *local_30;
  
  local_3c = 0;
  if (((edit->string).len == 0) || (nVar1 = (edit->string).buffer.allocated, nVar1 == 0)) {
    iVar2 = 0;
    iVar3 = 0;
  }
  else {
    iVar3 = (int)(edit->string).buffer.memory.ptr;
    iVar2 = (int)nVar1;
  }
  begin = nk_str_at_const(&edit->string,line_start_id,&local_38,&local_34);
  nVar4 = nk_text_calculate_text_bounds
                    (font,begin,(iVar3 + iVar2) - (int)begin,row_height,&local_30,(nk_vec2 *)0x0,
                     &local_3c,in_stack_ffffffffffffffb8);
  r->x0 = 0.0;
  r->x1 = nVar4.x;
  r->baseline_y_delta = nVar4.y;
  r->ymin = 0.0;
  r->ymax = nVar4.y;
  r->num_chars = local_3c;
  return;
}

Assistant:

NK_INTERN void
nk_textedit_layout_row(struct nk_text_edit_row *r, struct nk_text_edit *edit,
int line_start_id, float row_height, const struct nk_user_font *font)
{
int l;
int glyphs = 0;
nk_rune unicode;
const char *remaining;
int len = nk_str_len_char(&edit->string);
const char *end = nk_str_get_const(&edit->string) + len;
const char *text = nk_str_at_const(&edit->string, line_start_id, &unicode, &l);
const struct nk_vec2 size = nk_text_calculate_text_bounds(font,
text, (int)(end - text), row_height, &remaining, 0, &glyphs, NK_STOP_ON_NEW_LINE);

r->x0 = 0.0f;
r->x1 = size.x;
r->baseline_y_delta = size.y;
r->ymin = 0.0f;
r->ymax = size.y;
r->num_chars = glyphs;
}